

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkCecFraigPart(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nPartSize,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pMiter;
  int *piVar3;
  Abc_Frame_t *pAVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  uint uVar8;
  int local_9c;
  Abc_Ntk_t *pMiterPart;
  Abc_Ntk_t *local_90;
  Prove_Params_t Params;
  
  Prove_ParamsSetDefault(&Params);
  Params.nItersMax = 5;
  if (nPartSize < 1) {
    __assert_fail("nPartSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x10b,"void Abc_NtkCecFraigPart(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
  }
  local_9c = 1;
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,nPartSize,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar1 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar1 == 1) {
    pcVar6 = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar1 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      piVar3 = Abc_NtkVerifyGetCleanModel(pMiter,1);
      pMiter->pModel = piVar3;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar3);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_002cd95a;
    }
    local_90 = pNtk1;
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,"unset progressbar");
    uVar8 = 0;
    for (iVar1 = 0; iVar1 < pMiter->vPos->nSize; iVar1 = iVar1 + 1) {
      pObj = Abc_NtkPo(pMiter,iVar1);
      pAVar7 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      pAVar5 = Abc_AigConst1(pMiter);
      if (pAVar7 == pAVar5) {
        pMiterPart = (Abc_Ntk_t *)0x0;
        if ((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) goto LAB_002cd913;
LAB_002cd870:
        printf("Finished part %5d (out of %5d)\r",(ulong)(iVar1 + 1),
               (ulong)(uint)pMiter->vPos->nSize);
        uVar8 = uVar8 + nPartSize;
      }
      else {
        pAVar7 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        pcVar6 = Abc_ObjName(pObj);
        pMiterPart = Abc_NtkCreateCone(pMiter,pAVar7,pcVar6,0);
        if ((pObj->field_0x15 & 4) != 0) {
          pAVar7 = Abc_NtkPo(pMiterPart,0);
          pAVar7->field_0x15 = pAVar7->field_0x15 ^ 4;
        }
        iVar2 = Abc_NtkIvyProve(&pMiterPart,&Params);
        if (iVar2 != -1) {
          if (iVar2 != 0) goto LAB_002cd870;
LAB_002cd913:
          piVar3 = Abc_NtkVerifySimulatePattern(pMiterPart,pMiterPart->pModel);
          pcVar6 = "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.";
          if (*piVar3 == 1) {
            pcVar6 = "Networks are NOT EQUIVALENT.                 ";
          }
          puts(pcVar6);
          free(piVar3);
          pAVar4 = Abc_FrameGetGlobalFrame();
          Cmd_CommandExecute(pAVar4,"set progressbar");
          goto LAB_002cd95a;
        }
        printf("Networks are undecided (resource limits is reached).\r");
        local_9c = -1;
      }
      if (pMiterPart != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pMiterPart);
      }
    }
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,"set progressbar");
    if (local_9c == -1) {
      printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)uVar8,
             (ulong)(uint)local_90->vCos->nSize);
      goto LAB_002cd95a;
    }
    if (local_9c != 1) goto LAB_002cd95a;
    pcVar6 = "Networks are equivalent.                         ";
  }
  puts(pcVar6);
LAB_002cd95a:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    Abc_Obj_t * pObj;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    assert( nPartSize > 0 );

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, nPartSize, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // solve the problem iteratively for each output of the miter
    Status = 1;
    nOutputs = 0;
    Abc_NtkForEachPo( pMiter, pObj, i )
    {
        if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pMiter) )
        {
            if ( Abc_ObjFaninC0(pObj) ) // complemented -> const 0
                RetValue = 1;
            else
                RetValue = 0;
            pMiterPart = NULL;
        }
        else
        {
            // get the cone of this output
            pMiterPart = Abc_NtkCreateCone( pMiter, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 0 );
            if ( Abc_ObjFaninC0(pObj) )
                Abc_ObjXorFaninC( Abc_NtkPo(pMiterPart,0), 0 );
            // solve the cone
        //    RetValue = Abc_NtkMiterProve( &pMiterPart, pParams );
            RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        }

        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            break;
        }
        else
        {
            printf( "Finished part %5d (out of %5d)\r", i+1, Abc_NtkPoNum(pMiter) );
            nOutputs += nPartSize;
        }
//        if ( pMiter->pModel )
//            Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        if ( pMiterPart )
            Abc_NtkDelete( pMiterPart );
    }
  
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}